

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

bool PIT_CheckThing(FMultiBlockThingsIterator *it,CheckResult *cres,FBoundingBox *box,
                   FCheckPosition *tm)

{
  PClass *pPVar1;
  DObject *pDVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  DThinker *pDVar6;
  byte bVar7;
  unsigned_short uVar8;
  uint uVar9;
  int iVar10;
  ActorFlags *other;
  Self *pSVar11;
  MetaClass *pMVar12;
  MetaClass *pMVar13;
  AActor *pAVar14;
  bool *pbVar15;
  AActor *pAVar16;
  undefined8 uVar17;
  bool bVar18;
  double dVar19;
  double dVar20;
  byte local_529;
  bool local_518;
  bool local_517;
  int local_514;
  int local_49c;
  bool local_43a;
  bool local_408;
  int local_404;
  int local_3e4;
  byte local_3bc;
  bool local_3a9;
  bool local_389;
  bool local_361;
  bool local_321;
  TFlags<ActorFlag,_unsigned_int> local_308;
  TFlags<ActorFlag,_unsigned_int> local_304;
  TFlags<ActorFlag6,_unsigned_int> local_300;
  TFlags<ActorFlag,_unsigned_int> local_2fc;
  TFlags<ActorFlag,_unsigned_int> local_2f8;
  TFlags<ActorFlag,_unsigned_int> local_2f4;
  undefined1 local_2f0 [36];
  TFlags<ActorFlag2,_unsigned_int> local_2cc;
  TFlags<ActorFlag2,_unsigned_int> local_2c8;
  TFlags<ActorFlag2,_unsigned_int> local_2c4;
  TFlags<ActorFlag,_unsigned_int> local_2c0;
  TFlags<ActorFlag2,_unsigned_int> local_2bc;
  TFlags<ActorFlag7,_unsigned_int> local_2b8;
  TFlags<ActorFlag3,_unsigned_int> local_2b4;
  undefined1 local_2b0 [32];
  TFlags<ActorFlag3,_unsigned_int> local_290;
  undefined1 local_28c [4];
  TFlags<ActorFlag2,_unsigned_int> local_288;
  TFlags<ActorFlag2,_unsigned_int> local_284;
  TFlags<ActorFlag,_unsigned_int> local_280;
  TFlags<ActorFlag5,_unsigned_int> local_27c;
  TAngle<double> local_278;
  FName local_270;
  int local_26c;
  TFlags<ActorFlag7,_unsigned_int> local_268;
  int newdam_2;
  TFlags<ActorFlag4,_unsigned_int> local_260;
  FName local_25c;
  undefined1 local_258 [36];
  TFlags<ActorFlag2,_unsigned_int> local_234;
  TFlags<ActorFlag2,_unsigned_int> local_230;
  TFlags<ActorFlag3,_unsigned_int> local_22c;
  TAngle<double> local_228;
  FName local_21c;
  int local_218;
  FName local_214;
  int newdam_1;
  undefined1 local_20c [4];
  TFlags<ActorFlag2,_unsigned_int> local_208;
  TFlags<ActorFlag3,_unsigned_int> local_204;
  TFlags<ActorFlag2,_unsigned_int> local_200;
  TFlags<ActorFlag,_unsigned_int> local_1fc;
  bool *local_1f8;
  bool *check;
  TFlags<ActorFlag5,_unsigned_int> local_1e8;
  TFlags<ActorFlag4,_unsigned_int> local_1e4;
  TFlags<ActorFlag4,_unsigned_int> local_1e0;
  TFlags<ActorFlag,_unsigned_int> local_1dc;
  TFlags<ActorFlag,_unsigned_int> local_1d8;
  TFlags<ActorFlag,_unsigned_int> local_1d4;
  TFlags<ActorFlag,_unsigned_int> local_1d0;
  TFlags<ActorBounceFlag,_unsigned_short> local_1ca;
  double local_1c8;
  double clipheight;
  TFlags<ActorFlag,_unsigned_int> local_1b8;
  FName local_1b4;
  FName local_1b0;
  TFlags<ActorFlag6,_unsigned_int> local_1ac;
  TFlags<ActorFlag2,_unsigned_int> local_1a8;
  TFlags<ActorFlag3,_unsigned_int> local_1a4;
  TFlags<ActorFlag2,_unsigned_int> local_1a0;
  TFlags<ActorFlag,_unsigned_int> local_19c;
  TFlags<ActorBounceFlag,_unsigned_short> local_196;
  TFlags<ActorFlag,_unsigned_int> local_194;
  TAngle<double> local_190;
  FName local_184;
  TAngle<double> local_180;
  FName local_178;
  int local_174;
  undefined1 local_170 [4];
  int newdam;
  TFlags<ActorFlag3,_unsigned_int> local_160;
  TFlags<ActorFlag3,_unsigned_int> local_15c;
  TFlags<ActorFlag2,_unsigned_int> local_158;
  TFlags<ActorFlag,_unsigned_int> local_154;
  TFlags<ActorFlag2,_unsigned_int> local_150;
  TFlags<ActorFlag6,_unsigned_int> local_14c;
  TFlags<ActorFlag,_unsigned_int> local_148;
  TFlags<ActorFlag,_unsigned_int> local_144;
  TFlags<ActorFlag,_unsigned_int> local_140 [2];
  TFlags<ActorFlag,_unsigned_int> local_138;
  bool res;
  TFlags<ActorFlag3,_unsigned_int> local_130;
  TFlags<ActorFlag6,_unsigned_int> local_12c;
  TAngle<double> local_128;
  FName local_11c;
  Self local_118;
  FName local_114;
  FName local_110;
  TFlags<ActorFlag6,_unsigned_int> local_10c;
  TFlags<ActorFlag6,_unsigned_int> local_108;
  TFlags<ActorFlag,_unsigned_int> local_104;
  TFlags<ActorFlag6,_unsigned_int> local_100;
  TFlags<ActorFlag3,_unsigned_int> local_fc;
  TFlags<ActorFlag3,_unsigned_int> local_f8;
  TFlags<ActorFlag3,_unsigned_int> local_f4;
  TFlags<ActorFlag2,_unsigned_int> local_f0;
  TFlags<ActorFlag6,_unsigned_int> local_ec;
  TFlags<ActorFlag5,_unsigned_int> local_e8;
  TFlags<ActorFlag2,_unsigned_int> local_e4;
  TFlags<ActorFlag,_unsigned_int> local_e0;
  TFlags<ActorFlag4,_unsigned_int> local_dc;
  TFlags<ActorFlag2,_unsigned_int> local_d8;
  TFlags<ActorFlag3,_unsigned_int> local_d4;
  TFlags<ActorFlag3,_unsigned_int> local_d0;
  TFlags<ActorFlag3,_unsigned_int> local_cc;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_c8;
  double olddist;
  double newdist;
  DVector3 oldpos;
  TFlags<ActorFlag3,_unsigned_int> local_98;
  TFlags<ActorFlag4,_unsigned_int> local_94;
  TFlags<ActorFlag,_unsigned_int> local_90;
  undefined1 local_8c [4];
  TFlags<ActorFlag,_unsigned_int> local_88;
  TFlags<ActorFlag,_unsigned_int> local_84;
  TFlags<ActorFlag,_unsigned_int> local_80;
  bool local_79;
  FName local_78;
  bool unblocking;
  TFlags<ActorFlag6,_unsigned_int> local_70;
  TFlags<ActorFlag2,_unsigned_int> local_6c;
  TFlags<ActorFlag2,_unsigned_int> local_68;
  TFlags<ActorFlag2,_unsigned_int> local_64;
  anon_union_8_2_947301c2_for_TObjPtr<AActor>_1 local_60;
  double blockdist;
  TFlags<ActorFlag,_unsigned_int> local_50;
  TFlags<ActorFlag,_unsigned_int> local_4c;
  int local_48;
  bool local_41;
  int damage;
  bool solid;
  double topz;
  AActor *thing;
  FCheckPosition *tm_local;
  FBoundingBox *box_local;
  CheckResult *cres_local;
  FMultiBlockThingsIterator *it_local;
  
  topz = (double)cres->thing;
  if ((AActor *)topz == tm->thing) {
    return true;
  }
  other = &((AActor *)topz)->flags;
  thing = (AActor *)tm;
  tm_local = (FCheckPosition *)box;
  box_local = (FBoundingBox *)cres;
  cres_local = (CheckResult *)it;
  operator|((int)&blockdist + MF_SHOOTABLE,MF_SOLID);
  TFlags<ActorFlag,_unsigned_int>::operator|(&local_50,(int)&blockdist + MF_SHOOTABLE);
  TFlags<ActorFlag,_unsigned_int>::operator&(&local_4c,other);
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_4c);
  bVar18 = true;
  if (uVar9 == 0) {
    TFlags<ActorFlag6,_unsigned_int>::operator&
              ((TFlags<ActorFlag6,_unsigned_int> *)&blockdist,
               SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
    uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&blockdist);
    bVar18 = uVar9 != 0;
  }
  if (!bVar18) {
    return true;
  }
  local_60 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
             (*(double *)((long)topz + 0x158) +
             (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x2b]);
  dVar19 = AActor::X((AActor *)topz);
  if (((double)local_60 <= ABS(dVar19 - box_local->m_Box[1])) ||
     (dVar19 = AActor::Y((AActor *)topz), (double)local_60 <= ABS(dVar19 - box_local->m_Box[2]))) {
    return true;
  }
  pSVar11 = (Self *)((long)topz + 400);
  TFlags<ActorFlag2,_unsigned_int>::TFlags
            (&local_6c,(Self *)((thing->super_DThinker).super_DObject._vptr_DObject + 0x32));
  TFlags<ActorFlag2,_unsigned_int>::operator|(&local_68,pSVar11);
  TFlags<ActorFlag2,_unsigned_int>::operator&(&local_64,(ActorFlag2)&local_68);
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_64);
  if (uVar9 != 0) {
    return true;
  }
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_70,
             (int)(thing->super_DThinker).super_DObject._vptr_DObject +
             (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
  local_321 = false;
  if (uVar9 != 0) {
    (**(code **)(*(thing->super_DThinker).super_DObject._vptr_DObject + 0x108))
              (&stack0xffffffffffffff8c);
    (**(code **)(*(long *)topz + 0x108))(&local_78);
    local_321 = FName::operator==((FName *)&stack0xffffffffffffff8c,&local_78);
  }
  if (local_321 != false) {
    return true;
  }
  (thing->super_DThinker).super_DObject._vptr_DObject[100] = (_func_int *)topz;
  _damage = (DThinker *)AActor::Top((AActor *)topz);
  local_79 = false;
  if (((ulong)box_local[1].m_Box[0] & 0x80) == 0) {
    bVar18 = false;
    if ((i_compatflags & 0x10U) == 0) {
      pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
      operator|((EnumType)local_8c,MF_FLOAT);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_88,(ActorFlag)local_8c);
      TFlags<ActorFlag,_unsigned_int>::operator|(&local_84,(ActorFlag)&local_88);
      TFlags<ActorFlag,_unsigned_int>::operator&(&local_80,(Self *)((long)pp_Var5 + 0x18c));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
      bVar18 = false;
      if (uVar9 == 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_90,
                   SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_90);
        bVar18 = false;
        if (uVar9 != 0) {
          TFlags<ActorFlag4,_unsigned_int>::operator&
                    (&local_94,
                     SUB84(topz,0) +
                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_94);
          bVar18 = uVar9 != 0;
        }
      }
    }
    if (bVar18) {
      TFlags<ActorFlag3,_unsigned_int>::operator&
                (&local_98,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_98);
      pDVar6 = _damage;
      bVar18 = false;
      if ((uVar9 != 0) &&
         (bVar18 = false, (double)(thing->super_DThinker).NextThinker <= (double)_damage)) {
        dVar19 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        bVar18 = (double)pDVar6 <=
                 dVar19 + (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x76];
      }
      if (bVar18) {
        (thing->OldRenderPos).Z = topz;
        (thing->super_DThinker).NextThinker = _damage;
      }
    }
    if ((((ulong)(thing->OldRenderPos).X & 0x1000000) != 0) ||
       (bVar18 = false,
       (thing->super_DThinker).super_DObject._vptr_DObject[0x40] != (_func_int *)0x0)) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&oldpos.Z + 4),
                 SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&oldpos.Z + 4));
      bVar18 = uVar9 != 0;
    }
    if (bVar18) {
      AActor::PosRelative((DVector3 *)&newdist,
                          (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,
                          (AActor *)topz);
      pPVar1 = (thing->super_DThinker).super_DObject.Class;
      dVar19 = AActor::X((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
      if (((double)pPVar1 == dVar19) && (!NAN((double)pPVar1) && !NAN(dVar19))) {
        pDVar2 = (thing->super_DThinker).super_DObject.ObjNext;
        dVar19 = AActor::Y((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        if (((double)pDVar2 == dVar19) && (!NAN((double)pDVar2) && !NAN(dVar19))) {
          local_79 = true;
          goto LAB_0066c6ce;
        }
      }
      dVar19 = AActor::X((AActor *)topz);
      if ((ABS(dVar19 - newdist) <
           *(double *)((long)topz + 0x158) +
           (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x2b]) &&
         (dVar19 = AActor::Y((AActor *)topz),
         ABS(dVar19 - oldpos.X) <
         *(double *)((long)topz + 0x158) +
         (double)(thing->super_DThinker).super_DObject._vptr_DObject[0x2b])) {
        olddist = AActor::Distance2D((AActor *)topz,box_local->m_Box[1],box_local->m_Box[2]);
        local_c8 = (anon_union_8_2_947301c2_for_TObjPtr<AActor>_1)
                   AActor::Distance2D((AActor *)topz,newdist,oldpos.X);
        if ((double)local_c8 < olddist) {
          dVar19 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
          dVar20 = AActor::Z((AActor *)topz);
          if (dVar19 <= dVar20) {
LAB_0066c646:
            pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
            TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_d4,(Self *)((long)topz + 0x194));
            TFlags<ActorFlag3,_unsigned_int>::operator&(&local_d0,(Self *)((long)pp_Var5 + 0x194));
            TFlags<ActorFlag3,_unsigned_int>::operator&(&local_cc,(ActorFlag3)&local_d0);
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_cc);
            local_361 = uVar9 != 0;
          }
          else {
            dVar19 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            local_361 = true;
            if ((double)_damage <= dVar19) goto LAB_0066c646;
          }
          local_79 = local_361;
        }
      }
    }
  }
LAB_0066c6ce:
  TFlags<ActorFlag2,_unsigned_int>::operator&
            (&local_d8,
             (int)(thing->super_DThinker).super_DObject._vptr_DObject +
             (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_d8);
  if (uVar9 == 0) {
    TFlags<ActorFlag4,_unsigned_int>::operator&
              (&local_dc,
               SUB84(topz,0) + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH));
    uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_dc);
    bVar18 = false;
    if (uVar9 != 0) goto LAB_0066c735;
  }
  else {
LAB_0066c735:
    bVar18 = (i_compatflags & 0x10U) == 0;
  }
  if (bVar18) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_e0,
               (int)(thing->super_DThinker).super_DObject._vptr_DObject +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e0);
    bVar18 = true;
    if (uVar9 != 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_e4,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e4);
      bVar18 = true;
      if (uVar9 != 0) {
        TFlags<ActorFlag5,_unsigned_int>::operator&
                  (&local_e8,
                   SUB84(topz,0) +
                   (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|MF5_NOFORWARDFALL|MF5_NODROPOFF)
                  );
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_e8);
        bVar18 = true;
        if (uVar9 == 0) {
          TFlags<ActorFlag6,_unsigned_int>::operator&
                    (&local_ec,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_ec);
          bVar18 = false;
          if (uVar9 != 0) {
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_f0,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f0);
            bVar18 = uVar9 != 0;
          }
        }
      }
    }
    if (bVar18) {
      pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
      TFlags<ActorFlag3,_unsigned_int>::TFlags(&local_fc,(Self *)((long)topz + 0x194));
      TFlags<ActorFlag3,_unsigned_int>::operator&(&local_f8,(Self *)((long)pp_Var5 + 0x194));
      TFlags<ActorFlag3,_unsigned_int>::operator&(&local_f4,(ActorFlag3)&local_f8);
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_f4);
      if (uVar9 != 0) {
        return (bool)(local_79 & 1);
      }
      dVar19 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
      if ((double)_damage <= dVar19) {
        return true;
      }
      dVar19 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
      dVar20 = AActor::Z((AActor *)topz);
      if (dVar19 <= dVar20) {
        return true;
      }
    }
  }
  if (((thing->super_DThinker).super_DObject._vptr_DObject[0x40] != (_func_int *)0x0) &&
     ((*(uint *)((thing->super_DThinker).super_DObject._vptr_DObject[0x40] + 0xe8) & 0x2000) != 0))
  goto LAB_0066cddb;
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_100,SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_100);
  local_389 = false;
  if (uVar9 != 0) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_104,
               (int)(thing->super_DThinker).super_DObject._vptr_DObject +
               (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_104);
    local_389 = false;
    if ((uVar9 != 0) && (local_389 = false, 0 < *(int *)((long)topz + 0x1cc))) {
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_108,SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_108);
      if (uVar9 == 0) {
        bVar18 = AActor::IsSentient((AActor *)topz);
        local_389 = false;
        if (!bVar18) goto LAB_0066cbf0;
      }
      if (*(long *)((long)topz + 0x200) == 0) {
        pMVar12 = AActor::GetClass((AActor *)topz);
        pMVar13 = AActor::GetClass((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        local_389 = false;
        if (pMVar12 == pMVar13) goto LAB_0066cbf0;
      }
      TFlags<ActorFlag6,_unsigned_int>::operator&
                (&local_10c,SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_10c);
      if (uVar9 != 0) {
        (**(code **)(*(long *)topz + 0x108))(&local_110);
        (**(code **)(*(thing->super_DThinker).super_DObject._vptr_DObject + 0x108))(&local_114);
        bVar18 = FName::operator!=(&local_110,&local_114);
        local_389 = false;
        if (!bVar18) goto LAB_0066cbf0;
      }
      pDVar6 = _damage;
      dVar19 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
      local_389 = false;
      if (dVar19 <= (double)pDVar6) {
        dVar19 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        dVar20 = AActor::Z((AActor *)topz);
        local_389 = false;
        if (dVar20 <= dVar19) {
          bVar18 = TObjPtr<AActor>::operator!=
                             ((TObjPtr<AActor> *)((long)topz + 0x250),
                              (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
          local_3a9 = false;
          if (bVar18) {
            local_3a9 = TObjPtr<AActor>::operator!=
                                  ((TObjPtr<AActor> *)
                                   ((thing->super_DThinker).super_DObject._vptr_DObject + 0x4a),
                                   (AActor *)topz);
          }
          local_389 = local_3a9;
        }
      }
    }
  }
LAB_0066cbf0:
  if (local_389 != false) {
    operator~((EnumType)&local_118);
    TFlags<ActorFlag6,_unsigned_int>::operator&=
              ((TFlags<ActorFlag6,_unsigned_int> *)((long)topz + 0x1a0),&local_118);
    dVar19 = topz;
    iVar10 = *(int *)((long)topz + 0x1cc);
    FName::FName(&local_11c,NAME_None);
    TAngle<double>::TAngle(&local_128,0.0);
    P_DamageMobj((AActor *)dVar19,(AActor *)0x0,(AActor *)0x0,iVar10,&local_11c,8,&local_128);
    return true;
  }
  TFlags<ActorFlag6,_unsigned_int>::operator&
            (&local_12c,SUB84(topz,0) + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_12c);
  bVar18 = false;
  if (uVar9 != 0) {
    if ((thing->super_DThinker).super_DObject._vptr_DObject[0x40] == (_func_int *)0x0) {
      if ((*(uint *)((long)topz + 0x304) & 8) != 0) {
        TFlags<ActorFlag3,_unsigned_int>::operator&
                  (&local_130,
                   (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_130);
        if (uVar9 != 0) goto LAB_0066cd7f;
      }
      bVar18 = false;
      if ((*(uint *)((long)topz + 0x304) & 0x10) != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  ((TFlags<ActorFlag,_unsigned_int> *)&stack0xfffffffffffffecc,
                   (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&stack0xfffffffffffffecc);
        bVar18 = false;
        if (uVar9 != 0) goto LAB_0066cd7f;
      }
    }
    else {
LAB_0066cd7f:
      bVar18 = *(int *)((long)topz + 0x308) < level.maptime;
    }
  }
  if ((bVar18) &&
     (bVar18 = P_ActivateThingSpecial
                         ((AActor *)topz,
                          (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,false),
     bVar18)) {
    *(int *)((long)topz + 0x308) = level.maptime + 0x23;
  }
LAB_0066cddb:
  TFlags<ActorFlag,_unsigned_int>::operator&
            (&local_138,
             (int)(thing->super_DThinker).super_DObject._vptr_DObject +
             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_138);
  if (uVar9 == 0) {
    if (((thing->super_DThinker).super_DObject._vptr_DObject[0x40] == (_func_int *)0x0) ||
       ((*(uint *)((thing->super_DThinker).super_DObject._vptr_DObject[0x40] + 0xe8) & 0x2000) == 0)
       ) {
      TFlags<ActorFlag2,_unsigned_int>::operator&
                (&local_150,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_150);
      bVar18 = false;
      if (uVar9 != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_154,
                   SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_154);
        bVar18 = uVar9 != 0;
      }
      if (bVar18) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_158,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_158);
        bVar18 = false;
        if (uVar9 == 0) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_15c,
                     SUB84(topz,0) +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_15c);
          bVar18 = false;
          if (uVar9 != 0) {
            TFlags<ActorFlag3,_unsigned_int>::operator&
                      (&local_160,
                       SUB84(topz,0) +
                       (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_160);
            bVar18 = uVar9 == 0;
          }
        }
        if (bVar18) {
          TVector3<double>::XY((TVector3<double> *)local_170);
          TVector3<double>::operator+=((TVector3<double> *)((long)topz + 0xa8),(Vector2 *)local_170)
          ;
          dVar19 = topz;
          if (3.0 < *(double *)((long)topz + 0xa8) + *(double *)((long)topz + 0xb0)) {
            iVar10 = *(int *)((thing->super_DThinker).super_DObject._vptr_DObject + 0x77) / 100 + 1;
            pAVar14 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
            pAVar16 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
            local_48 = iVar10;
            FName::FName(&local_178,
                         (FName *)((long)(thing->super_DThinker).super_DObject._vptr_DObject + 0x3c4
                                  ));
            TAngle<double>::TAngle(&local_180,0.0);
            local_174 = P_DamageMobj((AActor *)dVar19,pAVar14,pAVar16,iVar10,&local_178,0,&local_180
                                    );
            local_3e4 = local_174;
            if (local_174 < 1) {
              local_3e4 = local_48;
            }
            P_TraceBleed(local_3e4,(AActor *)topz,
                         (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            dVar19 = topz;
            local_48 = *(int *)((long)topz + 0x3b8) / 100 + 1;
            pAVar14 = (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject;
            iVar10 = local_48 >> 2;
            FName::FName(&local_184,
                         (FName *)((long)(thing->super_DThinker).super_DObject._vptr_DObject + 0x3c4
                                  ));
            TAngle<double>::TAngle(&local_190,0.0);
            local_174 = P_DamageMobj(pAVar14,(AActor *)dVar19,(AActor *)dVar19,iVar10,&local_184,0,
                                     &local_190);
            local_404 = local_174;
            if (local_174 < 1) {
              local_404 = local_48;
            }
            P_TraceBleed(local_404,(AActor *)(thing->super_DThinker).super_DObject._vptr_DObject,
                         (AActor *)topz);
          }
          return false;
        }
      }
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_194,
                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_194);
      bVar18 = true;
      if (uVar9 == 0) {
        TFlags<ActorBounceFlag,_unsigned_short>::operator&
                  (&local_196,
                   (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                   (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
        uVar8 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_196);
        bVar18 = false;
        if (uVar8 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_19c,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_19c);
          bVar18 = uVar9 == 0;
        }
      }
      if (bVar18) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_1a0,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a0);
        if (uVar9 == 0) {
          TFlags<ActorFlag3,_unsigned_int>::operator&
                    (&local_1a4,
                     SUB84(topz,0) +
                     (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a4);
          bVar18 = false;
          if (uVar9 != 0) {
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      (&local_1a8,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1a8);
            bVar18 = uVar9 != 0;
          }
          if (bVar18) {
            it_local._7_1_ = true;
          }
          else {
            TFlags<ActorFlag6,_unsigned_int>::operator&
                      (&local_1ac,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ac);
            local_408 = false;
            if (uVar9 != 0) {
              pAVar14 = TObjPtr::operator_cast_to_AActor_
                                  ((TObjPtr *)
                                   ((thing->super_DThinker).super_DObject._vptr_DObject + 0x3b));
              local_408 = false;
              if (pAVar14 != (AActor *)0x0) {
                pAVar14 = TObjPtr<AActor>::operator->
                                    ((TObjPtr<AActor> *)
                                     ((thing->super_DThinker).super_DObject._vptr_DObject + 0x3b));
                (*(pAVar14->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_1b0);
                (**(code **)(*(long *)topz + 0x108))(&local_1b4);
                local_408 = FName::operator==(&local_1b0,&local_1b4);
              }
            }
            if (local_408 == false) {
              TFlags<ActorFlag,_unsigned_int>::operator&
                        (&local_1b8,
                         SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE))
              ;
              uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1b8);
              bVar18 = false;
              if (uVar9 != 0) {
                TFlags<ActorFlag2,_unsigned_int>::operator&
                          ((TFlags<ActorFlag2,_unsigned_int> *)((long)&clipheight + 4),
                           (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                           (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&clipheight + 4));
                bVar18 = false;
                if (uVar9 != 0) {
                  TFlags<ActorFlag,_unsigned_int>::operator&
                            ((TFlags<ActorFlag,_unsigned_int> *)&clipheight,
                             SUB84(topz,0) +
                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
                  uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&clipheight);
                  bVar18 = uVar9 == 0;
                }
              }
              if (bVar18) {
                it_local._7_1_ = true;
              }
              else {
                if (*(double *)((long)topz + 0x168) <= 0.0) {
                  if ((0.0 < *(double *)((long)topz + 0x168) ||
                       *(double *)((long)topz + 0x168) == 0.0) || ((i_compatflags & 0x80000U) == 0))
                  {
                    local_1c8 = *(double *)((long)topz + 0x160);
                  }
                  else {
                    local_1c8 = -*(double *)((long)topz + 0x168);
                  }
                }
                else {
                  local_1c8 = *(double *)((long)topz + 0x168);
                }
                dVar19 = AActor::Z((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
                dVar20 = AActor::Z((AActor *)topz);
                if (dVar19 <= dVar20 + local_1c8) {
                  dVar19 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject
                                      );
                  dVar20 = AActor::Z((AActor *)topz);
                  if (dVar20 <= dVar19) {
                    TFlags<ActorBounceFlag,_unsigned_short>::operator&
                              (&local_1ca,
                               (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                               (BOUNCE_Quiet|BOUNCE_UseSeeSound|BOUNCE_AutoOff|BOUNCE_Actors));
                    uVar8 = TFlags::operator_cast_to_unsigned_short((TFlags *)&local_1ca);
                    bVar18 = false;
                    if ((uVar8 != 0) &&
                       (bVar18 = true,
                       (thing->super_DThinker).super_DObject._vptr_DObject[0x30] != (_func_int *)0x0
                       )) {
                      TFlags<ActorFlag,_unsigned_int>::operator&
                                (&local_1d0,
                                 (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
                      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1d0);
                      bVar18 = uVar9 == 0;
                    }
                    if (bVar18) {
                      bVar18 = TObjPtr<AActor>::operator==
                                         ((TObjPtr<AActor> *)
                                          ((thing->super_DThinker).super_DObject._vptr_DObject +
                                          0x3b),(AActor *)topz);
                      it_local._7_1_ = true;
                      if (!bVar18) {
                        TFlags<ActorFlag,_unsigned_int>::operator&
                                  (&local_1d4,
                                   SUB84(topz,0) +
                                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
                        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1d4);
                        it_local._7_1_ = uVar9 == 0;
                      }
                    }
                    else {
                      pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
                      iVar10 = (**(code **)(*pp_Var5 + 0xb0))(pp_Var5,topz);
                      if (iVar10 == 0) {
                        it_local._7_1_ = false;
                      }
                      else if (iVar10 == 1) {
                        it_local._7_1_ = true;
                      }
                      else {
                        bVar18 = TObjPtr<AActor>::operator!=
                                           ((TObjPtr<AActor> *)
                                            ((thing->super_DThinker).super_DObject._vptr_DObject +
                                            0x3b),(AActor *)0x0);
                        dVar19 = topz;
                        if (bVar18) {
                          pAVar14 = TObjPtr::operator_cast_to_AActor_
                                              ((TObjPtr *)
                                               ((thing->super_DThinker).super_DObject._vptr_DObject
                                               + 0x3b));
                          dVar20 = topz;
                          if ((AActor *)dVar19 == pAVar14) {
                            return true;
                          }
                          pAVar14 = TObjPtr::operator_cast_to_AActor_
                                              ((TObjPtr *)
                                               ((thing->super_DThinker).super_DObject._vptr_DObject
                                               + 0x3b));
                          bVar18 = CanAttackHurt((AActor *)dVar20,pAVar14);
                          if (!bVar18) {
                            return false;
                          }
                        }
                        TFlags<ActorFlag,_unsigned_int>::operator&
                                  (&local_1d8,
                                   SUB84(topz,0) +
                                   (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
                        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1d8);
                        if (uVar9 == 0) {
                          TFlags<ActorFlag,_unsigned_int>::operator&
                                    (&local_1dc,
                                     SUB84(topz,0) +
                                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
                          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1dc);
                          it_local._7_1_ = uVar9 == 0;
                        }
                        else {
                          TFlags<ActorFlag4,_unsigned_int>::operator&
                                    (&local_1e0,
                                     SUB84(topz,0) +
                                     (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH
                                     ));
                          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1e0);
                          bVar18 = false;
                          if (uVar9 != 0) {
                            TFlags<ActorFlag4,_unsigned_int>::operator&
                                      (&local_1e4,
                                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|
                                       MF4_BOSSDEATH));
                            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1e4);
                            bVar18 = uVar9 == 0;
                          }
                          if (bVar18) {
                            it_local._7_1_ = true;
                          }
                          else {
                            local_43a = false;
                            if (((ulong)(thing->Angles).Yaw.Degrees & 1) != 0) {
                              TFlags<ActorFlag5,_unsigned_int>::operator&
                                        (&local_1e8,
                                         SUB84(topz,0) +
                                         (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|
                                          MF5_NOFORWARDFALL|MF5_NODROPOFF));
                              uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1e8);
                              local_43a = false;
                              if (uVar9 == 0) {
                                local_43a = CheckRipLevel((AActor *)topz,
                                                          (AActor *)
                                                          (thing->super_DThinker).super_DObject.
                                                          _vptr_DObject);
                              }
                            }
                            if (local_43a != false) {
                              TFlags<ActorFlag6,_unsigned_int>::operator&
                                        ((TFlags<ActorFlag6,_unsigned_int> *)((long)&check + 4),
                                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
                              uVar9 = TFlags::operator_cast_to_unsigned_int
                                                ((TFlags *)((long)&check + 4));
                              bVar18 = true;
                              if (uVar9 != 0) {
                                TFlags<ActorFlag2,_unsigned_int>::operator&
                                          ((TFlags<ActorFlag2,_unsigned_int> *)&check,
                                           SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                                uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&check);
                                bVar18 = uVar9 == 0;
                              }
                              if (bVar18) {
                                local_1f8 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                            ::CheckKey((
                                                  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                                  *)&thing->SpriteAngle,(AActor *)topz);
                                if ((local_1f8 == (bool *)0x0) || ((*local_1f8 & 1U) == 0)) {
                                  pbVar15 = TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                            ::operator[]((
                                                  TMap<AActor_*,_bool,_THashTraits<AActor_*>,_TValueTraits<bool>_>
                                                  *)&thing->SpriteAngle,(AActor *)topz);
                                  *pbVar15 = true;
                                  TFlags<ActorFlag,_unsigned_int>::operator&
                                            (&local_1fc,
                                             SUB84(topz,0) +
                                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|
                                             MF_SHOOTABLE));
                                  uVar9 = TFlags::operator_cast_to_unsigned_int
                                                    ((TFlags *)&local_1fc);
                                  bVar18 = false;
                                  if (uVar9 == 0) {
                                    TFlags<ActorFlag2,_unsigned_int>::operator&
                                              (&local_200,
                                               SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                                    uVar9 = TFlags::operator_cast_to_unsigned_int
                                                      ((TFlags *)&local_200);
                                    bVar18 = false;
                                    if (uVar9 == 0) {
                                      TFlags<ActorFlag3,_unsigned_int>::operator&
                                                (&local_204,
                                                 (int)(thing->super_DThinker).super_DObject.
                                                      _vptr_DObject +
                                                 (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|
                                                 MF3_NORADIUSDMG));
                                      uVar9 = TFlags::operator_cast_to_unsigned_int
                                                        ((TFlags *)&local_204);
                                      bVar18 = false;
                                      if (uVar9 == 0) {
                                        pSVar11 = (Self *)((long)topz + 400);
                                        operator|((EnumType)local_20c,MF2_INVULNERABLE);
                                        TFlags<ActorFlag2,_unsigned_int>::operator&
                                                  (&local_208,pSVar11);
                                        uVar9 = TFlags::operator_cast_to_unsigned_int
                                                          ((TFlags *)&local_208);
                                        bVar18 = uVar9 == 0;
                                      }
                                    }
                                  }
                                  if (bVar18) {
                                    P_RipperBlood((AActor *)
                                                  (thing->super_DThinker).super_DObject.
                                                  _vptr_DObject,(AActor *)topz);
                                  }
                                  pAVar14 = (AActor *)
                                            (thing->super_DThinker).super_DObject._vptr_DObject;
                                  FSoundID::FSoundID((FSoundID *)&newdam_1,"misc/ripslop");
                                  S_Sound(pAVar14,4,(FSoundID *)&newdam_1,1.0,1.001);
                                  dVar19 = topz;
                                  if ((0 < *(int *)((thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + 0x66)) &&
                                     (*(int *)((thing->super_DThinker).super_DObject._vptr_DObject +
                                              0x67) != -0x80000000)) {
                                    pAVar14 = (AActor *)
                                              (thing->super_DThinker).super_DObject._vptr_DObject;
                                    pAVar16 = TObjPtr::operator_cast_to_AActor_
                                                        ((TObjPtr *)
                                                         ((thing->super_DThinker).super_DObject.
                                                          _vptr_DObject + 0x3b));
                                    iVar10 = *(int *)((thing->super_DThinker).super_DObject.
                                                      _vptr_DObject + 0x66);
                                    iVar3 = *(int *)((thing->super_DThinker).super_DObject.
                                                     _vptr_DObject + 0x67);
                                    iVar4 = *(int *)((long)(thing->super_DThinker).super_DObject.
                                                           _vptr_DObject + 0x33c);
                                    FName::FName(&local_214,
                                                 (FName *)((long)(thing->super_DThinker).
                                                                 super_DObject._vptr_DObject + 0x334
                                                          ));
                                    P_PoisonMobj((AActor *)dVar19,pAVar14,pAVar16,iVar10,iVar3,iVar4
                                                 ,&local_214);
                                  }
                                  pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
                                  local_48 = (**(code **)(*pp_Var5 + 0x118))(pp_Var5,3,2);
                                  dVar19 = topz;
                                  pAVar14 = (AActor *)
                                            (thing->super_DThinker).super_DObject._vptr_DObject;
                                  pAVar16 = TObjPtr::operator_cast_to_AActor_
                                                      ((TObjPtr *)
                                                       ((thing->super_DThinker).super_DObject.
                                                        _vptr_DObject + 0x3b));
                                  iVar10 = local_48;
                                  FName::FName(&local_21c,
                                               (FName *)((long)(thing->super_DThinker).super_DObject
                                                               ._vptr_DObject + 0x3c4));
                                  TAngle<double>::TAngle(&local_228,0.0);
                                  local_218 = P_DamageMobj((AActor *)dVar19,pAVar14,pAVar16,iVar10,
                                                           &local_21c,0,&local_228);
                                  TFlags<ActorFlag3,_unsigned_int>::operator&
                                            (&local_22c,
                                             (int)(thing->super_DThinker).super_DObject.
                                                  _vptr_DObject +
                                             (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|
                                             MF3_NORADIUSDMG));
                                  uVar9 = TFlags::operator_cast_to_unsigned_int
                                                    ((TFlags *)&local_22c);
                                  if (uVar9 == 0) {
                                    if (local_218 < 1) {
                                      local_49c = local_48;
                                    }
                                    else {
                                      local_49c = local_218;
                                    }
                                    P_TraceBleed(local_49c,(AActor *)topz,
                                                 (AActor *)
                                                 (thing->super_DThinker).super_DObject._vptr_DObject
                                                );
                                  }
                                  TFlags<ActorFlag2,_unsigned_int>::operator&
                                            (&local_230,
                                             SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                                  uVar9 = TFlags::operator_cast_to_unsigned_int
                                                    ((TFlags *)&local_230);
                                  bVar18 = false;
                                  if (uVar9 != 0) {
                                    TFlags<ActorFlag2,_unsigned_int>::operator&
                                              (&local_234,
                                               (int)(thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY)
                                              );
                                    uVar9 = TFlags::operator_cast_to_unsigned_int
                                                      ((TFlags *)&local_234);
                                    bVar18 = uVar9 == 0;
                                  }
                                  if ((bVar18) &&
                                     (*(int *)((long)topz + 0x300) !=
                                      *(int *)((long)&(thing->Angles).Yaw.Degrees + 4))) {
                                    TVector3<double>::XY((TVector3<double> *)local_258);
                                    operator*((TVector2<double> *)(local_258 + 0x10),
                                              *(double *)((long)topz + 0x2f8));
                                    TVector3<double>::operator+=
                                              ((TVector3<double> *)((long)topz + 0xa8),
                                               (Vector2 *)(local_258 + 0x10));
                                    *(undefined4 *)((long)topz + 0x300) =
                                         *(undefined4 *)((long)&(thing->Angles).Yaw.Degrees + 4);
                                  }
                                }
                                TArray<spechit_t,_spechit_t>::Clear(&spechit);
                                return true;
                              }
                            }
                            dVar19 = topz;
                            if ((0 < *(int *)((thing->super_DThinker).super_DObject._vptr_DObject +
                                             0x66)) &&
                               (*(int *)((thing->super_DThinker).super_DObject._vptr_DObject + 0x67)
                                != -0x80000000)) {
                              pAVar14 = (AActor *)
                                        (thing->super_DThinker).super_DObject._vptr_DObject;
                              pAVar16 = TObjPtr::operator_cast_to_AActor_
                                                  ((TObjPtr *)
                                                   ((thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + 0x3b));
                              iVar10 = *(int *)((thing->super_DThinker).super_DObject._vptr_DObject
                                               + 0x66);
                              iVar3 = *(int *)((thing->super_DThinker).super_DObject._vptr_DObject +
                                              0x67);
                              iVar4 = *(int *)((long)(thing->super_DThinker).super_DObject.
                                                     _vptr_DObject + 0x33c);
                              FName::FName(&local_25c,
                                           (FName *)((long)(thing->super_DThinker).super_DObject.
                                                           _vptr_DObject + 0x334));
                              P_PoisonMobj((AActor *)dVar19,pAVar14,pAVar16,iVar10,iVar3,iVar4,
                                           &local_25c);
                            }
                            pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
                            TFlags<ActorFlag4,_unsigned_int>::operator&
                                      (&local_260,
                                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                       (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|
                                       MF4_BOSSDEATH));
                            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_260);
                            uVar17 = 7;
                            if (uVar9 != 0) {
                              uVar17 = 3;
                            }
                            local_48 = (**(code **)(*pp_Var5 + 0x118))(pp_Var5,uVar17,1);
                            bVar18 = true;
                            if (local_48 < 1) {
                              TFlags<ActorFlag6,_unsigned_int>::operator&
                                        ((TFlags<ActorFlag6,_unsigned_int> *)&newdam_2,
                                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
                              uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&newdam_2);
                              bVar18 = true;
                              if (uVar9 == 0) {
                                TFlags<ActorFlag7,_unsigned_int>::operator&
                                          (&local_268,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|
                                             MF7_ALWAYSTELEFRAG));
                                uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_268);
                                bVar18 = uVar9 != 0;
                              }
                            }
                            dVar19 = topz;
                            if (bVar18) {
                              pAVar14 = (AActor *)
                                        (thing->super_DThinker).super_DObject._vptr_DObject;
                              pAVar16 = TObjPtr::operator_cast_to_AActor_
                                                  ((TObjPtr *)
                                                   ((thing->super_DThinker).super_DObject.
                                                    _vptr_DObject + 0x3b));
                              iVar10 = local_48;
                              FName::FName(&local_270,
                                           (FName *)((long)(thing->super_DThinker).super_DObject.
                                                           _vptr_DObject + 0x3c4));
                              TAngle<double>::TAngle(&local_278,0.0);
                              local_26c = P_DamageMobj((AActor *)dVar19,pAVar14,pAVar16,iVar10,
                                                       &local_270,0,&local_278);
                              if (0 < local_48) {
                                TFlags<ActorFlag5,_unsigned_int>::operator&
                                          (&local_27c,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF5_BLOODSPLATTER|MF5_CHASEGOAL|MF5_COUNTSECRET|
                                              MF5_NOFORWARDFALL|MF5_NODROPOFF));
                                uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_27c);
                                bVar18 = false;
                                if (uVar9 != 0) {
                                  TFlags<ActorFlag,_unsigned_int>::operator&
                                            (&local_280,
                                             SUB84(topz,0) +
                                             (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|
                                             MF_SHOOTABLE));
                                  uVar9 = TFlags::operator_cast_to_unsigned_int
                                                    ((TFlags *)&local_280);
                                  bVar18 = false;
                                  if (uVar9 == 0) {
                                    TFlags<ActorFlag2,_unsigned_int>::operator&
                                              (&local_284,
                                               SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                                    uVar9 = TFlags::operator_cast_to_unsigned_int
                                                      ((TFlags *)&local_284);
                                    bVar18 = false;
                                    if (uVar9 == 0) {
                                      pSVar11 = (Self *)((long)topz + 400);
                                      operator|((EnumType)local_28c,MF2_INVULNERABLE);
                                      TFlags<ActorFlag2,_unsigned_int>::operator&
                                                (&local_288,pSVar11);
                                      uVar9 = TFlags::operator_cast_to_unsigned_int
                                                        ((TFlags *)&local_288);
                                      bVar18 = false;
                                      if (uVar9 == 0) {
                                        TFlags<ActorFlag3,_unsigned_int>::operator&
                                                  (&local_290,
                                                   (int)(thing->super_DThinker).super_DObject.
                                                        _vptr_DObject +
                                                   (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|
                                                   MF3_NORADIUSDMG));
                                        uVar9 = TFlags::operator_cast_to_unsigned_int
                                                          ((TFlags *)&local_290);
                                        bVar18 = false;
                                        if (uVar9 == 0) {
                                          iVar10 = FRandom::operator()(&pr_checkthing);
                                          bVar18 = iVar10 < 0xc0;
                                        }
                                      }
                                    }
                                  }
                                }
                                if (bVar18) {
                                  AActor::Pos((DVector3 *)(local_2b0 + 8),
                                              (AActor *)
                                              (thing->super_DThinker).super_DObject._vptr_DObject);
                                  dVar19 = topz;
                                  AActor::AngleTo((AActor *)local_2b0,
                                                  (AActor *)
                                                  (thing->super_DThinker).super_DObject.
                                                  _vptr_DObject,SUB81(topz,0));
                                  P_BloodSplatter((DVector3 *)(local_2b0 + 8),(AActor *)dVar19,
                                                  (DAngle *)local_2b0);
                                }
                                TFlags<ActorFlag3,_unsigned_int>::operator&
                                          (&local_2b4,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|
                                             MF3_NORADIUSDMG));
                                uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2b4);
                                if (uVar9 == 0) {
                                  if (local_26c < 1) {
                                    local_514 = local_48;
                                  }
                                  else {
                                    local_514 = local_26c;
                                  }
                                  P_TraceBleed(local_514,(AActor *)topz,
                                               (AActor *)
                                               (thing->super_DThinker).super_DObject._vptr_DObject);
                                }
                              }
                            }
                            else {
                              P_GiveBody((AActor *)topz,-local_48,0);
                            }
                            TFlags<ActorFlag7,_unsigned_int>::operator&
                                      (&local_2b8,
                                       SUB84(topz,0) +
                                       (MF7_DONTTHRUST|MF7_FOILBUDDHA|MF7_HARMFRIENDS|
                                       MF7_ALWAYSTELEFRAG));
                            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2b8);
                            bVar18 = false;
                            if (uVar9 != 0) {
                              TFlags<ActorFlag2,_unsigned_int>::operator&
                                        (&local_2bc,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY)
                                        );
                              uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2bc);
                              bVar18 = false;
                              if (uVar9 != 0) {
                                TFlags<ActorFlag,_unsigned_int>::operator&
                                          (&local_2c0,
                                           (int)(thing->super_DThinker).super_DObject._vptr_DObject
                                           + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|
                                             MF_SHOOTABLE));
                                uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c0);
                                bVar18 = uVar9 != 0;
                              }
                            }
                            if (bVar18) {
                              TFlags<ActorFlag2,_unsigned_int>::operator&
                                        (&local_2c4,
                                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                                         (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                              uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c4);
                              if (uVar9 != 0) {
                                (thing->super_DThinker).super_DObject._vptr_DObject[0x49] =
                                     (thing->super_DThinker).super_DObject._vptr_DObject[0x3b];
                              }
                              TObjPtr<AActor>::operator=
                                        ((TObjPtr<AActor> *)
                                         ((thing->super_DThinker).super_DObject._vptr_DObject + 0x3b
                                         ),(AActor *)topz);
                              it_local._7_1_ = true;
                            }
                            else {
                              it_local._7_1_ = false;
                            }
                          }
                        }
                      }
                    }
                  }
                  else {
                    it_local._7_1_ = true;
                  }
                }
                else {
                  it_local._7_1_ = true;
                }
              }
            }
            else {
              it_local._7_1_ = true;
            }
          }
        }
        else {
          it_local._7_1_ = true;
        }
      }
      else {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_2c8,SUB84(topz,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c8);
        bVar18 = false;
        if (uVar9 != 0) {
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_2cc,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2cc);
          bVar18 = uVar9 == 0;
        }
        if ((bVar18) &&
           (*(int *)((long)topz + 0x300) != *(int *)((long)&(thing->Angles).Yaw.Degrees + 4))) {
          TVector3<double>::XY((TVector3<double> *)local_2f0);
          operator*((TVector2<double> *)(local_2f0 + 0x10),*(double *)((long)topz + 0x2f8));
          TVector3<double>::operator+=
                    ((TVector3<double> *)((long)topz + 0xa8),(Vector2 *)(local_2f0 + 0x10));
          *(undefined4 *)((long)topz + 0x300) =
               *(undefined4 *)((long)&(thing->Angles).Yaw.Degrees + 4);
        }
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_2f4,
                   SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2f4);
        local_517 = false;
        if (uVar9 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_2f8,
                     SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2f8);
          local_517 = false;
          if (uVar9 == 0) {
            TFlags<ActorFlag,_unsigned_int>::operator&
                      (&local_2fc,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2fc);
            local_518 = true;
            if (uVar9 == 0) {
              TFlags<ActorFlag6,_unsigned_int>::operator&
                        (&local_300,
                         (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                         (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
              uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_300);
              local_518 = uVar9 != 0;
            }
            local_517 = local_518;
          }
        }
        local_41 = local_517;
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_304,
                   SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_304);
        bVar18 = false;
        if (uVar9 != 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_308,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_308);
          bVar18 = false;
          if (uVar9 != 0) {
            dVar19 = AActor::Z((AActor *)topz);
            dVar20 = AActor::Top((AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
            bVar18 = dVar19 < dVar20 - (double)(thing->super_DThinker).super_DObject._vptr_DObject
                                               [0x76];
          }
        }
        if (bVar18) {
          P_TouchSpecialThing((AActor *)topz,
                              (AActor *)(thing->super_DThinker).super_DObject._vptr_DObject);
        }
        local_529 = 1;
        if ((local_41 & 1U) != 0) {
          local_529 = local_79;
        }
        it_local._7_1_ = (bool)(local_529 & 1);
      }
    }
    else {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (local_140,
                 SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)local_140);
      bVar18 = false;
      if (uVar9 != 0) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_144,
                   SUB84(topz,0) + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
        uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_144);
        bVar18 = false;
        if (uVar9 == 0) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_148,
                     (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_148);
          bVar18 = true;
          if (uVar9 == 0) {
            TFlags<ActorFlag6,_unsigned_int>::operator&
                      (&local_14c,
                       (int)(thing->super_DThinker).super_DObject._vptr_DObject +
                       (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
            uVar9 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_14c);
            bVar18 = uVar9 != 0;
          }
        }
      }
      local_3bc = 1;
      if (bVar18) {
        local_3bc = local_79;
      }
      it_local._7_1_ = (bool)(local_3bc & 1);
    }
  }
  else {
    pp_Var5 = (thing->super_DThinker).super_DObject._vptr_DObject;
    bVar7 = (**(code **)(*pp_Var5 + 0xa8))
                      (pp_Var5,(thing->super_DThinker).super_DObject._vptr_DObject[100]);
    it_local._7_1_ = (bool)(bVar7 & 1);
    (thing->super_DThinker).super_DObject._vptr_DObject[100] = (_func_int *)0x0;
  }
  return it_local._7_1_;
}

Assistant:

bool PIT_CheckThing(FMultiBlockThingsIterator &it, FMultiBlockThingsIterator::CheckResult &cres, const FBoundingBox &box, FCheckPosition &tm)
{
	AActor *thing = cres.thing;
	double topz;
	bool 	solid;
	int 	damage;

	// don't clip against self
	if (thing == tm.thing)
		return true;

	if (!((thing->flags & (MF_SOLID | MF_SPECIAL | MF_SHOOTABLE)) || thing->flags6 & MF6_TOUCHY))
		return true;	// can't hit thing

	double blockdist = thing->radius + tm.thing->radius;
	if (fabs(thing->X() - cres.Position.X) >= blockdist || fabs(thing->Y() - cres.Position.Y) >= blockdist)
		return true;

	if ((thing->flags2 | tm.thing->flags2) & MF2_THRUACTORS)
		return true;

	if ((tm.thing->flags6 & MF6_THRUSPECIES) && (tm.thing->GetSpecies() == thing->GetSpecies()))
		return true;

	tm.thing->BlockingMobj = thing;
	topz = thing->Top();

	// Both things overlap in x or y direction
	bool unblocking = false;

	// walking on other actors and unblocking is too messy through restricted portal types so disable it.
	if (!(cres.portalflags & FFCF_RESTRICTEDPORTAL))
	{
		if (!(i_compatflags & COMPATF_NO_PASSMOBJ) && !(tm.thing->flags & (MF_FLOAT | MF_MISSILE | MF_SKULLFLY | MF_NOGRAVITY)) &&
			(thing->flags & MF_SOLID) && (thing->flags4 & MF4_ACTLIKEBRIDGE))
		{
			// [RH] Let monsters walk on actors as well as floors
			if ((tm.thing->flags3 & MF3_ISMONSTER) &&
				topz >= tm.floorz && topz <= tm.thing->Z() + tm.thing->MaxStepHeight)
			{
				// The commented-out if is an attempt to prevent monsters from walking off a
				// thing further than they would walk off a ledge. I can't think of an easy
				// way to do this, so I restrict them to only walking on bridges instead.
				// Uncommenting the if here makes it almost impossible for them to walk on
				// anything, bridge or otherwise.
				//			if (abs(thing->x - tmx) <= thing->radius &&
				//				abs(thing->y - tmy) <= thing->radius)
				{
					tm.stepthing = thing;
					tm.floorz = topz;
				}
			}
		}

		if (((tm.FromPMove || tm.thing->player != NULL) && thing->flags&MF_SOLID))
		{
			DVector3 oldpos = tm.thing->PosRelative(thing);
			// Both actors already overlap. To prevent them from remaining stuck allow the move if it
			// takes them further apart or the move does not change the position (when called from P_ChangeSector.)
			if (tm.pos.X == tm.thing->X() && tm.pos.Y == tm.thing->Y())
			{
				unblocking = true;
			}
			else if (fabs(thing->X() - oldpos.X) < (thing->radius + tm.thing->radius) &&
				fabs(thing->Y() - oldpos.Y) < (thing->radius + tm.thing->radius))

			{
				double newdist = thing->Distance2D(cres.Position.X, cres.Position.Y);
				double olddist = thing->Distance2D(oldpos.X, oldpos.Y);

				if (newdist > olddist)
				{
					// unblock only if there's already a vertical overlap (or both actors are flagged not to overlap)
					unblocking = (tm.thing->Top() > thing->Z() && tm.thing->Z() < topz) || (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP);
				}
			}
		}
	}

	// [RH] If the other thing is a bridge, then treat the moving thing as if it had MF2_PASSMOBJ, so
	// you can use a scrolling floor to move scenery items underneath a bridge.
	if ((tm.thing->flags2 & MF2_PASSMOBJ || thing->flags4 & MF4_ACTLIKEBRIDGE) && !(i_compatflags & COMPATF_NO_PASSMOBJ))
	{ // check if a mobj passed over/under another object
		if (!(tm.thing->flags & MF_MISSILE) ||
			!(tm.thing->flags2 & MF2_RIP) ||
			(thing->flags5 & MF5_DONTRIP) ||
			((tm.thing->flags6 & MF6_NOBOSSRIP) && (thing->flags2 & MF2_BOSS)))
		{
			if (tm.thing->flags3 & thing->flags3 & MF3_DONTOVERLAP)
			{ // Some things prefer not to overlap each other, if possible
				return unblocking;
			}
			if ((tm.thing->Z() >= topz) || (tm.thing->Top() <= thing->Z()))
				return true;
		}
	}

	if (tm.thing->player == NULL || !(tm.thing->player->cheats & CF_PREDICTING))
	{
		// touchy object is alive, toucher is solid
		if (thing->flags6 & MF6_TOUCHY && tm.thing->flags & MF_SOLID && thing->health > 0 &&
			// Thing is an armed mine or a sentient thing
			(thing->flags6 & MF6_ARMED || thing->IsSentient()) &&
			// either different classes or players
			(thing->player || thing->GetClass() != tm.thing->GetClass()) &&
			// or different species if DONTHARMSPECIES
			(!(thing->flags6 & MF6_DONTHARMSPECIES) || thing->GetSpecies() != tm.thing->GetSpecies()) &&
			// touches vertically
			topz >= tm.thing->Z() && tm.thing->Top() >= thing->Z() &&
			// prevents lost souls from exploding when fired by pain elementals
			(thing->master != tm.thing && tm.thing->master != thing))
			// Difference with MBF: MBF hardcodes the LS/PE check and lets actors of the same species
			// but different classes trigger the touchiness, but that seems less straightforwards.
		{
			thing->flags6 &= ~MF6_ARMED; // Disarm
			P_DamageMobj(thing, NULL, NULL, thing->health, NAME_None, DMG_FORCED);  // kill object
			return true;
		}

		// Check for MF6_BUMPSPECIAL
		// By default, only players can activate things by bumping into them
		if ((thing->flags6 & MF6_BUMPSPECIAL) && ((tm.thing->player != NULL)
			|| ((thing->activationtype & THINGSPEC_MonsterTrigger) && (tm.thing->flags3 & MF3_ISMONSTER))
			|| ((thing->activationtype & THINGSPEC_MissileTrigger) && (tm.thing->flags & MF_MISSILE))
			) && (level.maptime > thing->lastbump)) // Leave the bumper enough time to go away
		{
			if (P_ActivateThingSpecial(thing, tm.thing))
				thing->lastbump = level.maptime + TICRATE;
		}
	}

	// Check for skulls slamming into things
	if (tm.thing->flags & MF_SKULLFLY)
	{
		bool res = tm.thing->Slam(tm.thing->BlockingMobj);
		tm.thing->BlockingMobj = NULL;
		return res;
	}

	// [ED850] Player Prediction ends here. There is nothing else they could/should do.
	if (tm.thing->player != NULL && (tm.thing->player->cheats & CF_PREDICTING))
	{
		solid = (thing->flags & MF_SOLID) &&
			!(thing->flags & MF_NOCLIP) &&
			((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

		return !solid || unblocking;
	}

	// Check for blasted thing running into another
	if ((tm.thing->flags2 & MF2_BLASTED) && (thing->flags & MF_SHOOTABLE))
	{
		if (!(thing->flags2 & MF2_BOSS) && (thing->flags3 & MF3_ISMONSTER) && !(thing->flags3 & MF3_DONTBLAST))
		{
			// ideally this should take the mass factor into account
			thing->Vel += tm.thing->Vel.XY();
			if ((thing->Vel.X + thing->Vel.Y) > 3.)
			{
				int newdam;
				damage = (tm.thing->Mass / 100) + 1;
				newdam = P_DamageMobj(thing, tm.thing, tm.thing, damage, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				damage = (thing->Mass / 100) + 1;
				newdam = P_DamageMobj(tm.thing, thing, thing, damage >> 2, tm.thing->DamageType);
				P_TraceBleed(newdam > 0 ? newdam : damage, tm.thing, thing);
			}
			return false;
		}
	}
	// Check for missile or non-solid MBF bouncer
	if (tm.thing->flags & MF_MISSILE || ((tm.thing->BounceFlags & BOUNCE_MBF) && !(tm.thing->flags & MF_SOLID)))
	{
		// Check for a non-shootable mobj
		if (thing->flags2 & MF2_NONSHOOTABLE)
		{
			return true;
		}
		// Check for passing through a ghost
		if ((thing->flags3 & MF3_GHOST) && (tm.thing->flags2 & MF2_THRUGHOST))
		{
			return true;
		}

		if ((tm.thing->flags6 & MF6_MTHRUSPECIES)
			&& tm.thing->target // NULL pointer check
			&& (tm.thing->target->GetSpecies() == thing->GetSpecies()))
			return true;

		// Check for rippers passing through corpses
		if ((thing->flags & MF_CORPSE) && (tm.thing->flags2 & MF2_RIP) && !(thing->flags & MF_SHOOTABLE))
		{
			return true;
		}

		double clipheight;

		if (thing->projectilepassheight > 0)
		{
			clipheight = thing->projectilepassheight;
		}
		else if (thing->projectilepassheight < 0 && (i_compatflags & COMPATF_MISSILECLIP))
		{
			clipheight = -thing->projectilepassheight;
		}
		else
		{
			clipheight = thing->Height;
		}

		// Check if it went over / under
		if (tm.thing->Z() > thing->Z() + clipheight)
		{ // Over thing
			return true;
		}
		if (tm.thing->Top() < thing->Z())
		{ // Under thing
			return true;
		}

		// [RH] What is the point of this check, again? In Hexen, it is unconditional,
		// but here we only do it if the missile's damage is 0.
		// MBF bouncer might have a non-0 damage value, but they must not deal damage on impact either.
		if ((tm.thing->BounceFlags & BOUNCE_Actors) && (tm.thing->Damage == 0 || !(tm.thing->flags & MF_MISSILE)))
		{
			return (tm.thing->target == thing || !(thing->flags & MF_SOLID));
		}

		switch (tm.thing->SpecialMissileHit(thing))
		{
		case 0:		return false;
		case 1:		return true;
		default:	break;
		}

		// [RH] Extend DeHacked infighting to allow for monsters
		// to never fight each other

		if (tm.thing->target != NULL)
		{
			if (thing == tm.thing->target)
			{ // Don't missile self
				return true;
			}

			if (!CanAttackHurt(thing, tm.thing->target))
			{
				return false;
			}
		}
		if (!(thing->flags & MF_SHOOTABLE))
		{ // Didn't do any damage
			return !(thing->flags & MF_SOLID);
		}
		if ((thing->flags4 & MF4_SPECTRAL) && !(tm.thing->flags4 & MF4_SPECTRAL))
		{
			return true;
		}

		if ((tm.DoRipping && !(thing->flags5 & MF5_DONTRIP)) && CheckRipLevel(thing, tm.thing))
		{
			if (!(tm.thing->flags6 & MF6_NOBOSSRIP) || !(thing->flags2 & MF2_BOSS))
			{
				bool *check = tm.LastRipped.CheckKey(thing);
				if (check == NULL || !*check)
				{
					tm.LastRipped[thing] = true;
					if (!(thing->flags & MF_NOBLOOD) &&
						!(thing->flags2 & MF2_REFLECTIVE) &&
						!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
						!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)))
					{ // Ok to spawn blood
						P_RipperBlood(tm.thing, thing);
					}
					S_Sound(tm.thing, CHAN_BODY, "misc/ripslop", 1, ATTN_IDLE);

					// Do poisoning (if using new style poison)
					if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
					{
						P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
					}

					damage = tm.thing->GetMissileDamage(3, 2);
					int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
					if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
					{
						P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
					}
					if (thing->flags2 & MF2_PUSHABLE
						&& !(tm.thing->flags2 & MF2_CANNOTPUSH))
					{ // Push thing
						if (thing->lastpush != tm.PushTime)
						{
							thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
							thing->lastpush = tm.PushTime;
						}
					}
				}
				spechit.Clear();
				return true;
			}
		}

		// Do poisoning (if using new style poison)
		if (tm.thing->PoisonDamage > 0 && tm.thing->PoisonDuration != INT_MIN)
		{
			P_PoisonMobj(thing, tm.thing, tm.thing->target, tm.thing->PoisonDamage, tm.thing->PoisonDuration, tm.thing->PoisonPeriod, tm.thing->PoisonDamageType);
		}

		// Do damage
		damage = tm.thing->GetMissileDamage((tm.thing->flags4 & MF4_STRIFEDAMAGE) ? 3 : 7, 1);
		if ((damage > 0) || (tm.thing->flags6 & MF6_FORCEPAIN) || (tm.thing->flags7 & MF7_CAUSEPAIN))
		{
			int newdam = P_DamageMobj(thing, tm.thing, tm.thing->target, damage, tm.thing->DamageType);
			if (damage > 0)
			{
				if ((tm.thing->flags5 & MF5_BLOODSPLATTER) &&
					!(thing->flags & MF_NOBLOOD) &&
					!(thing->flags2 & MF2_REFLECTIVE) &&
					!(thing->flags2 & (MF2_INVULNERABLE | MF2_DORMANT)) &&
					!(tm.thing->flags3 & MF3_BLOODLESSIMPACT) &&
					(pr_checkthing() < 192))
				{
					P_BloodSplatter(tm.thing->Pos(), thing, tm.thing->AngleTo(thing));
				}
				if (!(tm.thing->flags3 & MF3_BLOODLESSIMPACT))
				{
					P_TraceBleed(newdam > 0 ? newdam : damage, thing, tm.thing);
				}
			}
		}
		else
		{
			P_GiveBody(thing, -damage);
		}

		if ((thing->flags7 & MF7_THRUREFLECT) && (thing->flags2 & MF2_REFLECTIVE) && (tm.thing->flags & MF_MISSILE))
		{
			if (tm.thing->flags2 & MF2_SEEKERMISSILE)
			{
				tm.thing->tracer = tm.thing->target;
			}
			tm.thing->target = thing;
			return true;
		}
		return false;		// don't traverse any more
	}
	if (thing->flags2 & MF2_PUSHABLE && !(tm.thing->flags2 & MF2_CANNOTPUSH))
	{ // Push thing
		if (thing->lastpush != tm.PushTime)
		{
			thing->Vel += tm.thing->Vel.XY() * thing->pushfactor;
			thing->lastpush = tm.PushTime;
		}
	}
	solid = (thing->flags & MF_SOLID) &&
		!(thing->flags & MF_NOCLIP) &&
		((tm.thing->flags & MF_SOLID) || (tm.thing->flags6 & MF6_BLOCKEDBYSOLIDACTORS));

	// Check for special pickup
	if ((thing->flags & MF_SPECIAL) && (tm.thing->flags & MF_PICKUP)
		// [RH] The next condition is to compensate for the extra height
		// that gets added by P_CheckPosition() so that you cannot pick
		// up things that are above your true height.
		&& thing->Z() < tm.thing->Top() - tm.thing->MaxStepHeight)
	{ // Can be picked up by tmthing
		P_TouchSpecialThing(thing, tm.thing);	// can remove thing
	}

	// killough 3/16/98: Allow non-solid moving objects to move through solid
	// ones, by allowing the moving thing (tmthing) to move if it's non-solid,
	// despite another solid thing being in the way.
	// killough 4/11/98: Treat no-clipping things as not blocking

	return !solid || unblocking;

	// return !(thing->flags & MF_SOLID);	// old code -- killough
}